

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManLutFaninCount(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar4 = 0;
  if (1 < (long)p->nObjs) {
    uVar1 = p->vMapping->nSize;
    uVar5 = 1;
    if (1 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    iVar4 = 0;
    uVar6 = 1;
    do {
      if (uVar5 == uVar6) {
LAB_0020c223:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = p->vMapping->pArray;
      uVar2 = piVar3[uVar6];
      if ((ulong)uVar2 != 0) {
        if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) goto LAB_0020c223;
        iVar4 = iVar4 + piVar3[uVar2];
      }
      uVar6 = uVar6 + 1;
    } while ((long)p->nObjs != uVar6);
  }
  return iVar4;
}

Assistant:

int Gia_ManLutFaninCount( Gia_Man_t * p )
{
    int i, Counter = 0;
    Gia_ManForEachLut( p, i )
        Counter += Gia_ObjLutSize(p, i);
    return Counter;
}